

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void setptmode(global_State *g,GCproto *pt,int mode)

{
  int mode_local;
  GCproto *pt_local;
  global_State *g_local;
  
  if ((mode & 0x100U) == 0) {
    if ((mode & 0x200U) == 0) {
      pt->flags = pt->flags | 8;
    }
    lj_trace_flushproto(g,pt);
  }
  else {
    pt->flags = pt->flags & 0xf7;
    lj_trace_reenableproto(pt);
  }
  return;
}

Assistant:

static void setptmode(global_State *g, GCproto *pt, int mode)
{
  if ((mode & LUAJIT_MODE_ON)) {  /* (Re-)enable JIT compilation. */
    pt->flags &= ~PROTO_NOJIT;
    lj_trace_reenableproto(pt);  /* Unpatch all ILOOP etc. bytecodes. */
  } else {  /* Flush and/or disable JIT compilation. */
    if (!(mode & LUAJIT_MODE_FLUSH))
      pt->flags |= PROTO_NOJIT;
    lj_trace_flushproto(g, pt);  /* Flush all traces of prototype. */
  }
}